

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O3

void kratos::EventRemoval::process_block(StmtBlock *block)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  long lVar2;
  shared_ptr<kratos::Stmt> *stmt;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long lVar4;
  undefined1 local_68 [8];
  shared_ptr<kratos::AuxiliaryStmt> aux;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  
  aux.super___shared_ptr<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  stmts_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stmts_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar2 = (long)(block->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(block->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 4;
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    lVar4 = 8;
    do {
      psVar1 = (block->stmts_).
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      stmts_to_remove.
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)psVar1 + lVar4 + -8);
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(psVar1->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              + lVar4);
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      if (*(int *)&stmts_to_remove.
                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage[7].
                   super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          0xd) {
        Stmt::as<kratos::AuxiliaryStmt>((Stmt *)local_68);
        if (*(int *)((long)local_68 + 0xc0) == 0) {
          std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
          emplace_back<std::shared_ptr<kratos::Stmt>const&>
                    ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                      *)&aux.super___shared_ptr<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,
                     (shared_ptr<kratos::Stmt> *)
                     &stmts_to_remove.
                      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (aux.super___shared_ptr<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     aux.super___shared_ptr<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      psVar1 = stmts_to_remove.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x10;
      lVar2 = lVar2 + -1;
      _Var3._M_pi = aux.super___shared_ptr<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    } while (lVar2 != 0);
    for (; _Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar1;
        _Var3._M_pi = _Var3._M_pi + 1) {
      (*(block->super_Stmt).super_IRNode._vptr_IRNode[10])(block,_Var3._M_pi);
    }
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          &aux.super___shared_ptr<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void process_block(StmtBlock *block) {
        auto stmt_count = block->size();
        std::vector<std::shared_ptr<Stmt>> stmts_to_remove;
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto const &stmt = block->get_stmt(i);
            if (stmt->type() == StatementType::Auxiliary) {
                auto aux = stmt->as<AuxiliaryStmt>();
                if (aux->aux_type() == AuxiliaryType::EventTracing)
                    stmts_to_remove.emplace_back(stmt);
            }
        }
        for (auto const &stmt : stmts_to_remove) {
            block->remove_stmt(stmt);
        }
    }